

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O0

int Inter_ManCheckInductiveContainment(Aig_Man_t *pTrans,Aig_Man_t *pInter,int nSteps,int fBackward)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  sat_solver *s;
  int status;
  int nRegs;
  int f;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Ptr_t *vMapRegs;
  Aig_Obj_t **ppNodes;
  Aig_Man_t *pFrames;
  int fBackward_local;
  int nSteps_local;
  Aig_Man_t *pInter_local;
  Aig_Man_t *pTrans_local;
  
  pFrames._0_4_ = fBackward;
  pFrames._4_4_ = nSteps;
  _fBackward_local = pInter;
  pInter_local = pTrans;
  iVar1 = Saig_ManRegNum(pTrans);
  if (iVar1 < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intContain.c"
                  ,199,"int Inter_ManCheckInductiveContainment(Aig_Man_t *, Aig_Man_t *, int, int)")
    ;
  }
  ppNodes = (Aig_Obj_t **)Inter_ManFramesLatches(pInter_local,pFrames._4_4_,(Vec_Ptr_t **)&pCnf);
  iVar2 = Vec_PtrSize((Vec_Ptr_t *)pCnf);
  if (iVar2 != (pFrames._4_4_ + 1) * iVar1) {
    __assert_fail("Vec_PtrSize(vMapRegs) == (nSteps + 1) * nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intContain.c"
                  ,0xca,"int Inter_ManCheckInductiveContainment(Aig_Man_t *, Aig_Man_t *, int, int)"
                 );
  }
  vMapRegs = (Vec_Ptr_t *)Vec_PtrArray((Vec_Ptr_t *)pCnf);
  if ((int)pFrames == 0) {
    for (status = 0; status < pFrames._4_4_; status = status + 1) {
      Inter_ManAppendCone(_fBackward_local,(Aig_Man_t *)ppNodes,
                          (Aig_Obj_t **)(&vMapRegs->nCap + (long)(status * iVar1) * 2),0);
    }
    Inter_ManAppendCone(_fBackward_local,(Aig_Man_t *)ppNodes,
                        (Aig_Obj_t **)(&vMapRegs->nCap + (long)(status * iVar1) * 2),1);
  }
  else {
    Inter_ManAppendCone(_fBackward_local,(Aig_Man_t *)ppNodes,(Aig_Obj_t **)vMapRegs,1);
    for (status = 1; status <= pFrames._4_4_; status = status + 1) {
      Inter_ManAppendCone(_fBackward_local,(Aig_Man_t *)ppNodes,
                          (Aig_Obj_t **)(&vMapRegs->nCap + (long)(status * iVar1) * 2),0);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)pCnf);
  Aig_ManCleanup((Aig_Man_t *)ppNodes);
  p = Cnf_Derive((Aig_Man_t *)ppNodes,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p);
    Aig_ManStop((Aig_Man_t *)ppNodes);
    pTrans_local._4_4_ = 1;
  }
  else {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    Cnf_DataFree(p);
    Aig_ManStop((Aig_Man_t *)ppNodes);
    sat_solver_delete(s);
    pTrans_local._4_4_ = (uint)(iVar1 == -1);
  }
  return pTrans_local._4_4_;
}

Assistant:

int Inter_ManCheckInductiveContainment( Aig_Man_t * pTrans, Aig_Man_t * pInter, int nSteps, int fBackward )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t ** ppNodes;
    Vec_Ptr_t * vMapRegs;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int f, nRegs, status;
    nRegs = Saig_ManRegNum(pTrans);
    assert( nRegs > 0 );
    // generate the timeframes 
    pFrames = Inter_ManFramesLatches( pTrans, nSteps, &vMapRegs );
    assert( Vec_PtrSize(vMapRegs) == (nSteps + 1) * nRegs );
    // add main constraints to the timeframes
    ppNodes = (Aig_Obj_t **)Vec_PtrArray(vMapRegs);
    if ( !fBackward )
    { 
        // forward inductive check: p -> p -> ... -> !p
        for ( f = 0; f < nSteps; f++ )
            Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 0 );
        Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 1 );
    }
    else
    {
        // backward inductive check: p -> !p -> ... -> !p
        Inter_ManAppendCone( pInter, pFrames, ppNodes + 0 * nRegs, 1 );
        for ( f = 1; f <= nSteps; f++ )
            Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 0 );
    }
    Vec_PtrFree( vMapRegs );
    Aig_ManCleanup( pFrames );

    // convert to CNF
    pCnf = Cnf_Derive( pFrames, 0 ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//    Cnf_DataFree( pCnf );
//    Aig_ManStop( pFrames );

    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        Aig_ManStop( pFrames );
        return 1;
    }

     // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );

//    Inter_ManCheckUniqueness( pTrans, pSat, pCnf, nSteps );

    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );

    sat_solver_delete( pSat );
    return status == l_False;
}